

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mkvparser.cc
# Opt level: O3

longlong mkvparser::Chapters::Atom::GetTime(Chapters *pChapters,longlong timecode)

{
  SegmentInfo *pSVar1;
  long lVar2;
  longlong lVar3;
  
  lVar3 = -1;
  if (((pChapters != (Chapters *)0x0) && (pChapters->m_pSegment != (Segment *)0x0)) &&
     (pSVar1 = pChapters->m_pSegment->m_pInfo, pSVar1 != (SegmentInfo *)0x0)) {
    lVar2 = pSVar1->m_timecodeScale;
    lVar3 = lVar2 * timecode;
    if (lVar2 < 1) {
      lVar3 = -1;
    }
    if (timecode < 0) {
      lVar3 = -1;
    }
  }
  return lVar3;
}

Assistant:

long long Chapters::Atom::GetTime(const Chapters* pChapters,
                                  long long timecode) {
  if (pChapters == NULL)
    return -1;

  Segment* const pSegment = pChapters->m_pSegment;

  if (pSegment == NULL)  // weird
    return -1;

  const SegmentInfo* const pInfo = pSegment->GetInfo();

  if (pInfo == NULL)
    return -1;

  const long long timecode_scale = pInfo->GetTimeCodeScale();

  if (timecode_scale < 1)  // weird
    return -1;

  if (timecode < 0)
    return -1;

  const long long result = timecode_scale * timecode;

  return result;
}